

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.h
# Opt level: O3

bool llvm::DWARFDebugLine::Sequence::orderByHighPC(Sequence *LHS,Sequence *RHS)

{
  bool bVar1;
  
  bVar1 = true;
  if (RHS->SectionIndex <= LHS->SectionIndex) {
    if (RHS->SectionIndex < LHS->SectionIndex) {
      bVar1 = false;
    }
    else {
      bVar1 = LHS->HighPC < RHS->HighPC;
    }
  }
  return bVar1;
}

Assistant:

static bool orderByHighPC(const Sequence &LHS, const Sequence &RHS) {
      return std::tie(LHS.SectionIndex, LHS.HighPC) <
             std::tie(RHS.SectionIndex, RHS.HighPC);
    }